

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O0

int IDASetNonlinearSolverSensSim(void *ida_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  N_Vector p_Var2;
  SUNNonlinearSolver in_RSI;
  IDAMem in_RDI;
  int is;
  int retval;
  IDAMem IDA_mem;
  int local_28;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x34,"IDASetNonlinearSolverSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    IDAProcessError((IDAMem)0x0,-0x16,0x3c,"IDASetNonlinearSolverSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    IDAProcessError(in_RDI,-0x16,0x45,"IDASetNonlinearSolverSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else {
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      if (in_RDI->ida_sensi == 0) {
        IDAProcessError(in_RDI,-0x16,0x55,"IDASetNonlinearSolverSensSim",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                        ,"Illegal attempt to call before calling IDASensInit.");
        local_4 = -0x16;
      }
      else if (in_RDI->ida_ism == 1) {
        if ((in_RDI->NLSsim != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLSsim != 0)) {
          SUNNonlinSolFree(in_RDI->NLSsim);
        }
        in_RDI->NLSsim = in_RSI;
        in_RDI->ownNLSsim = 0;
        iVar1 = SUNNonlinSolSetSysFn(in_RDI->NLSsim,idaNlsResidualSensSim);
        if (iVar1 == 0) {
          iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLSsim,idaNlsConvTestSensSim,in_RDI);
          if (iVar1 == 0) {
            iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLSsim,4);
            if (iVar1 == 0) {
              if (in_RDI->simMallocDone == 0) {
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns + 1,in_RDI->ida_sunctx);
                in_RDI->ypredictSim = p_Var2;
                if (in_RDI->ypredictSim == (N_Vector)0x0) {
                  IDAProcessError(in_RDI,-0x15,0x92,"IDASetNonlinearSolverSensSim",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns + 1,in_RDI->ida_sunctx);
                in_RDI->ycorSim = p_Var2;
                if (in_RDI->ycorSim == (N_Vector)0x0) {
                  N_VDestroy(in_RDI->ypredictSim);
                  IDAProcessError(in_RDI,-0x15,0x9c,"IDASetNonlinearSolverSensSim",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->ida_Ns + 1,in_RDI->ida_sunctx);
                in_RDI->ewtSim = p_Var2;
                if (in_RDI->ewtSim == (N_Vector)0x0) {
                  N_VDestroy(in_RDI->ypredictSim);
                  N_VDestroy(in_RDI->ycorSim);
                  IDAProcessError(in_RDI,-0x15,0xa7,"IDASetNonlinearSolverSensSim",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                                  ,"A memory request failed.");
                  return -0x15;
                }
                in_RDI->simMallocDone = 1;
              }
              **in_RDI->ypredictSim->content = in_RDI->ida_yypredict;
              **in_RDI->ycorSim->content = in_RDI->ida_ee;
              **in_RDI->ewtSim->content = in_RDI->ida_ewt;
              for (local_28 = 0; local_28 < in_RDI->ida_Ns; local_28 = local_28 + 1) {
                *(N_Vector *)(*in_RDI->ypredictSim->content + (long)(local_28 + 1) * 8) =
                     in_RDI->ida_yySpredict[local_28];
                *(N_Vector *)(*in_RDI->ycorSim->content + (long)(local_28 + 1) * 8) =
                     in_RDI->ida_eeS[local_28];
                *(N_Vector *)(*in_RDI->ewtSim->content + (long)(local_28 + 1) * 8) =
                     in_RDI->ida_ewtS[local_28];
              }
              if (in_RDI->ida_res == (IDAResFn)0x0) {
                IDAProcessError(in_RDI,-0x16,0xbe,"IDASetNonlinearSolverSensSim",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                                ,"The DAE residual function is NULL");
                local_4 = -0x16;
              }
              else {
                in_RDI->nls_res = in_RDI->ida_res;
                local_4 = 0;
              }
            }
            else {
              IDAProcessError(in_RDI,-0x16,0x86,"IDASetNonlinearSolverSensSim",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                              ,"Setting maximum number of nonlinear iterations failed");
              local_4 = -0x16;
            }
          }
          else {
            IDAProcessError(in_RDI,-0x16,0x7d,"IDASetNonlinearSolverSensSim",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                            ,"Setting convergence test function failed");
            local_4 = -0x16;
          }
        }
        else {
          IDAProcessError(in_RDI,-0x16,0x73,"IDASetNonlinearSolverSensSim",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                          ,"Setting nonlinear system function failed");
          local_4 = -0x16;
        }
      }
      else {
        IDAProcessError(in_RDI,-0x16,0x5d,"IDASetNonlinearSolverSensSim",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                        ,"Sensitivity solution method is not IDA_SIMULTANEOUS");
        local_4 = -0x16;
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x4d,"IDASetNonlinearSolverSensSim",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                      ,"NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDASetNonlinearSolverSensSim(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval, is;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(IDA_mem->ida_sensi))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_ILL_INPUT);
  }

  /* check that the simultaneous corrector was selected */
  if (IDA_mem->ida_ism != IDA_SIMULTANEOUS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Sensitivity solution method is not IDA_SIMULTANEOUS");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLSsim != NULL) && (IDA_mem->ownNLSsim))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLSsim);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLSsim = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLSsim = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLSsim, idaNlsResidualSensSim);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLSsim, idaNlsConvTestSensSim,
                                     ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLSsim, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (IDA_mem->simMallocDone == SUNFALSE)
  {
    IDA_mem->ypredictSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                                   IDA_mem->ida_sunctx);
    if (IDA_mem->ypredictSim == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ycorSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                               IDA_mem->ida_sunctx);
    if (IDA_mem->ycorSim == NULL)
    {
      N_VDestroy(IDA_mem->ypredictSim);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ewtSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                              IDA_mem->ida_sunctx);
    if (IDA_mem->ewtSim == NULL)
    {
      N_VDestroy(IDA_mem->ypredictSim);
      N_VDestroy(IDA_mem->ycorSim);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->simMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  NV_VEC_SW(IDA_mem->ypredictSim, 0) = IDA_mem->ida_yypredict;
  NV_VEC_SW(IDA_mem->ycorSim, 0)     = IDA_mem->ida_ee;
  NV_VEC_SW(IDA_mem->ewtSim, 0)      = IDA_mem->ida_ewt;

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    NV_VEC_SW(IDA_mem->ypredictSim, is + 1) = IDA_mem->ida_yySpredict[is];
    NV_VEC_SW(IDA_mem->ycorSim, is + 1)     = IDA_mem->ida_eeS[is];
    NV_VEC_SW(IDA_mem->ewtSim, is + 1)      = IDA_mem->ida_ewtS[is];
  }

  /* Set the nonlinear system RES function */
  if (!(IDA_mem->ida_res))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The DAE residual function is NULL");
    return (IDA_ILL_INPUT);
  }
  IDA_mem->nls_res = IDA_mem->ida_res;

  return (IDA_SUCCESS);
}